

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Face(Map *this,Character *from,Direction direction)

{
  Character *other;
  bool bVar1;
  int num;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  
  from->direction = direction;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder(&builder,PACKET_FACE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,num);
  PacketBuilder::AddChar(&builder,(uint)direction);
  p_Var2 = (_List_node_base *)&this->characters;
  while (p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->characters) {
    other = (Character *)p_Var2[1]._M_next;
    if (other != from) {
      bVar1 = Character::InRange(from,other);
      if (bVar1) {
        Character::Send(other,&builder);
      }
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map::Face(Character *from, Direction direction)
{
	from->direction = direction;

	from->CancelSpell();

	PacketBuilder builder(PACKET_FACE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}